

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall CLI::App::operator[](App *this,char *option_name)

{
  Option *pOVar1;
  allocator local_39;
  string local_38;
  char *local_18;
  char *option_name_local;
  App *this_local;
  
  local_18 = option_name;
  option_name_local = (char *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,option_name,&local_39);
  pOVar1 = get_option(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return pOVar1;
}

Assistant:

const Option *operator[](const char *option_name) const { return get_option(option_name); }